

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SimpleAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SimpleAssertionExpr,slang::ast::Expression_const&,std::optional<slang::ast::SequenceRepetition>&>
          (BumpAllocator *this,Expression *args,optional<slang::ast::SequenceRepetition> *args_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined3 uVar4;
  SimpleAssertionExpr *pSVar5;
  
  pSVar5 = (SimpleAssertionExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SimpleAssertionExpr *)this->endPtr < pSVar5 + 1) {
    pSVar5 = (SimpleAssertionExpr *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pSVar5 + 1);
  }
  bVar3 = (args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>)._M_payload.
          super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged;
  uVar4 = *(undefined3 *)
           &(args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>)._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRepetition>.field_0x11;
  uVar1 = *(undefined8 *)
           &(args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>)._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload;
  uVar2 = *(undefined8 *)
           ((long)&(args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>).
                   _M_payload.super__Optional_payload_base<slang::ast::SequenceRepetition>.
                   _M_payload + 8);
  (pSVar5->super_AssertionExpr).kind = Simple;
  (pSVar5->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pSVar5->expr = args;
  *(undefined8 *)
   &(pSVar5->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
    .super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload = uVar1;
  *(undefined8 *)
   ((long)&(pSVar5->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>.
           _M_payload.super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload + 8) =
       uVar2;
  (pSVar5->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged = bVar3;
  *(undefined3 *)
   &(pSVar5->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload
    .super__Optional_payload_base<slang::ast::SequenceRepetition>.field_0x11 = uVar4;
  return pSVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }